

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::MultipleConcatenationExpressionSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,MultipleConcatenationExpressionSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (MultipleConcatenationExpressionSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 1;
    break;
  case (MultipleConcatenationExpressionSyntax *)0x1:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[2].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (MultipleConcatenationExpressionSyntax *)0x2:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[3].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  case (MultipleConcatenationExpressionSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 3;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)
         (__index_type *)
         ((long)&(pPVar1->super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>).
                 super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> + 8);
}

Assistant:

PtrTokenOrSyntax MultipleConcatenationExpressionSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openBrace;
        case 1: return expression.get();
        case 2: return concatenation.get();
        case 3: return &closeBrace;
        default: return nullptr;
    }
}